

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall
core::image::double_to_byte_image(image *this,ConstPtr *image,double vmin,double vmax)

{
  element_type *peVar1;
  pointer pdVar2;
  int i;
  long lVar3;
  invalid_argument *this_00;
  double dVar4;
  Ptr PVar5;
  
  if ((image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    Image<unsigned_char>::create();
    peVar1 = (image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    TypedImageBase<unsigned_char>::allocate
              (*(TypedImageBase<unsigned_char> **)this,
               (peVar1->super_TypedImageBase<double>).super_ImageBase.w,
               (peVar1->super_TypedImageBase<double>).super_ImageBase.h,
               (peVar1->super_TypedImageBase<double>).super_ImageBase.c);
    lVar3 = 0;
    while( true ) {
      peVar1 = (image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pdVar2 = (peVar1->super_TypedImageBase<double>).data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (long)(int)((ulong)((long)*(pointer *)
                                         ((long)&(peVar1->super_TypedImageBase<double>).data.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 (long)pdVar2) >> 3);
      if ((long)PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi <= lVar3) break;
      dVar4 = pdVar2[lVar3];
      if (dVar4 <= vmin) {
        dVar4 = vmin;
      }
      if (vmax <= dVar4) {
        dVar4 = vmax;
      }
      *(char *)(*(long *)(*(long *)this + 0x18) + lVar3) =
           (char)(int)(((dVar4 - vmin) * 255.0) / (vmax - vmin) + 0.5);
      lVar3 = lVar3 + 1;
    }
    PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
double_to_byte_image (DoubleImage::ConstPtr image, double vmin, double vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * (value - vmin) / (vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}